

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddPchDependencies(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *language;
  long lVar1;
  cmTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  string *language_00;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  cmValue cVar8;
  cmValue name;
  cmSourceFile *pcVar9;
  cmGeneratorTarget *reuseTarget;
  string *psVar10;
  iterator iVar11;
  ostream *poVar12;
  iterator __begin4;
  ulong uVar13;
  pointer arch;
  size_type sVar14;
  _Alloc_hider _Var15;
  iterator __end4;
  pointer ppcVar16;
  undefined1 *puVar17;
  pointer pbVar18;
  long lVar19;
  pointer ppcVar20;
  bool bVar21;
  bool bVar22;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  string_view source;
  string compilerVersion;
  string useMultiArchPch;
  string err;
  string pchHeader_1;
  string langFlags;
  string pchFile;
  string pchHeader;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string configUpper;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pchLangSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configsList;
  string local_3d8;
  string *local_3b8;
  string local_3b0;
  string local_390;
  string local_370;
  string *local_350;
  string local_348;
  string local_328;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *local_308;
  string local_300;
  undefined1 local_2e0 [32];
  char *local_2c0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0 [2];
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  ios_base local_270 [264];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130;
  string *local_110;
  cmGeneratorTarget *local_108;
  long local_100;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  string local_b8;
  string *local_98;
  cmOutputConverter *local_90;
  cmListFileBacktrace *local_88;
  string *local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_48,this->Makefile,IncludeEmptyConfig);
  local_98 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_90 = &this->super_cmOutputConverter;
    local_88 = &this->DirectoryBacktrace;
    local_308 = &AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_;
    pbVar18 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles(target,&local_168,pbVar18);
      local_3b8 = pbVar18;
      cmsys::SystemTools::UpperCase(&local_b8,pbVar18);
      if ((AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_ == '\0') &&
         (iVar6 = __cxa_guard_acquire(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_),
         iVar6 != 0)) {
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,"C","");
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[1]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[1].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 1)
                   ,"CXX","");
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[2]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[2].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 2)
                   ,"OBJC","");
        AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[3]._M_dataplus._M_p =
             (pointer)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[3].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems + 3)
                   ,"OBJCXX","");
        __cxa_atexit(std::
                     array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                     ::~array,&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_);
      }
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
      if ((char)iVar6 != '\0') {
        lVar19 = 0;
        do {
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
          language = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                             _M_dataplus._M_p + lVar19);
          cmGeneratorTarget::GetPchHeader((string *)local_2e0,target,local_3b8,language,&local_3b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
            operator_delete(local_3b0._M_dataplus._M_p,
                            CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                                     local_3b0.field_2._M_local_buf[0]) + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_78,language);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
          }
          lVar19 = lVar19 + 0x20;
        } while (lVar19 != 0x80);
      }
      lVar19 = 0;
      do {
        ppcVar16 = local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        ppcVar20 = local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_d8 = local_c8;
        lVar1 = *(long *)((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems
                                 [0]._M_dataplus._M_p + lVar19);
        local_100 = lVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,lVar1,
                   *(long *)((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_.
                                    _M_elems[0]._M_string_length + lVar19) + lVar1);
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_d8,local_d0 + (long)local_d8);
        local_2e0._0_8_ = local_2e0 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2e0,local_370._M_dataplus._M_p,
                   local_370._M_dataplus._M_p + local_370._M_string_length);
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b0,local_2e0._0_8_,
                   (char *)((long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2e0._8_8_ + local_2e0._0_8_));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
        }
        if (ppcVar20 == ppcVar16) {
          bVar21 = true;
        }
        else {
          lVar19 = 0;
          do {
            pcVar9 = *ppcVar20;
            cmSourceFile::GetLanguage_abi_cxx11_((string *)local_2e0,pcVar9);
            if (local_3b0._M_string_length == local_2e0._8_8_) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._M_string_length ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar21 = true;
              }
              else {
                iVar6 = bcmp(local_3b0._M_dataplus._M_p,(void *)local_2e0._0_8_,
                             local_3b0._M_string_length);
                bVar21 = iVar6 == 0;
              }
            }
            else {
              bVar21 = false;
            }
            if (bVar21) {
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              local_328._M_dataplus._M_p = (pointer)0x17;
              local_130._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_328);
              local_130.field_2._M_allocated_capacity = (size_type)local_328._M_dataplus._M_p;
              builtin_strncpy(local_130._M_dataplus._M_p,"SKIP_PRECOMPILE_HEADERS",0x17);
              local_130._M_string_length = (size_type)local_328._M_dataplus._M_p;
              local_130._M_dataplus._M_p[(long)local_328._M_dataplus._M_p] = '\0';
              cVar8 = cmSourceFile::GetProperty(pcVar9,&local_130);
              uVar13 = (ulong)(cVar8.Value == (string *)0x0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                (ulong)(local_130.field_2._M_allocated_capacity + 1));
              }
            }
            else {
              uVar13 = 0;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
              operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
            }
            lVar19 = lVar19 + uVar13;
            ppcVar20 = ppcVar20 + 1;
          } while (ppcVar20 != ppcVar16);
          bVar21 = lVar19 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,
                          CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                                   local_3b0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        if (!bVar21) {
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
          if ((char)iVar6 == '\0') {
            cmGeneratorTarget::GetAppleArchs(target,local_3b8,&local_148);
          }
          pbVar18 = local_148.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar10 = local_3b8;
          local_350 = (string *)
                      ((long)&AddPchDependencies(cmGeneratorTarget*)::langs_abi_cxx11_._M_elems[0].
                              _M_dataplus._M_p + local_100);
          if (local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(&local_148);
          }
          else {
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            local_3b0._M_string_length = 0;
            local_3b0.field_2._M_local_buf[0] = '\0';
            arch = local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            do {
              cmGeneratorTarget::GetPchHeader(&local_370,target,psVar10,local_350,arch);
              if (local_370._M_string_length != 0) {
                local_2e0._0_8_ = local_3b0._M_string_length;
                local_2e0._8_8_ = local_3b0._M_dataplus._M_p;
                local_2e0._16_8_ = 8;
                local_2e0._24_8_ = ";-Xarch_";
                local_2c0[1] = (arch->_M_dataplus)._M_p;
                local_2c0[0] = (char *)arch->_M_string_length;
                local_2b0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
                local_2b0[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6ef692;
                local_2a0 = local_370._M_string_length;
                local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_370._M_dataplus._M_p;
                views._M_len = 5;
                views._M_array = (iterator)local_2e0;
                cmCatViews_abi_cxx11_(&local_328,views);
                std::__cxx11::string::operator=((string *)&local_3b0,(string *)&local_328);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  operator_delete(local_328._M_dataplus._M_p,
                                  local_328.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._M_dataplus._M_p != &local_370.field_2) {
                operator_delete(local_370._M_dataplus._M_p,
                                local_370.field_2._M_allocated_capacity + 1);
              }
              arch = arch + 1;
            } while (arch != pbVar18);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pcVar2 = target->Target;
              local_2e0._8_8_ = (local_350->_M_dataplus)._M_p;
              local_2e0._0_8_ = local_350->_M_string_length;
              local_2e0._16_8_ = 0x18;
              local_2e0._24_8_ = "_COMPILE_OPTIONS_USE_PCH";
              views_00._M_len = 2;
              views_00._M_array = (iterator)local_2e0;
              cmCatViews_abi_cxx11_(&local_370,views_00);
              local_2e0._24_8_ = (psVar10->_M_dataplus)._M_p;
              local_2e0._16_8_ = psVar10->_M_string_length;
              local_2e0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
              local_2e0._8_8_ = "$<$<CONFIG:";
              local_2c0[0] = &DAT_00000002;
              local_2c0[1] = ">:";
              local_2b0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_3b0._M_string_length;
              local_2b0[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_3b0._M_dataplus._M_p;
              local_2a0 = 1;
              local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x6f30e8;
              views_01._M_len = 5;
              views_01._M_array = (iterator)local_2e0;
              cmCatViews_abi_cxx11_(&local_328,views_01);
              local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00;
              cmTarget::AppendProperty
                        (pcVar2,&local_370,&local_328,(optional<cmListFileBacktrace> *)local_2e0,
                         false);
              if ((local_2e0[0x10] == '\x01') &&
                 (local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00,
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._M_dataplus._M_p != &local_370.field_2) {
                operator_delete(local_370._M_dataplus._M_p,
                                local_370.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,
                              CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                                       local_3b0.field_2._M_local_buf[0]) + 1);
            }
          }
          local_80 = local_148.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pbVar18 = local_148.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_148.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              language_00 = local_350;
              psVar10 = local_3b8;
              cmGeneratorTarget::GetPchSource(&local_3b0,target,local_3b8,local_350,pbVar18);
              cmGeneratorTarget::GetPchHeader(&local_370,target,psVar10,language_00,pbVar18);
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._M_string_length ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 (local_370._M_string_length == 0)) {
                iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
                ppcVar20 = local_168.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                ppcVar16 = local_168.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                if (((byte)iVar6 & local_78._M_impl.super__Rb_tree_header._M_node_count != 0) == 1)
                {
                  for (; ppcVar16 != ppcVar20; ppcVar16 = ppcVar16 + 1) {
                    pcVar9 = *ppcVar16;
                    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_2e0,pcVar9);
                    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (iVar11 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::find(&local_78,(string *)local_2e0),
                       (_Rb_tree_header *)iVar11._M_node == &local_78._M_impl.super__Rb_tree_header)
                       ) {
                      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_328,"SKIP_PRECOMPILE_HEADERS","");
                      cmSourceFile::SetProperty(pcVar9,&local_328,"ON");
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_328._M_dataplus._M_p != &local_328.field_2) {
                        operator_delete(local_328._M_dataplus._M_p,
                                        local_328.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
                      operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                    }
                  }
                }
              }
              else {
                pcVar3 = this->Makefile;
                local_2e0._0_8_ = local_2e0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2e0,"CMAKE_PCH_EXTENSION","");
                cVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_2e0);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
                  operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                }
                if ((cVar8.Value != (string *)0x0) && ((cVar8.Value)->_M_string_length != 0)) {
                  local_2e0._0_8_ = local_2e0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_2e0,"PRECOMPILE_HEADERS_REUSE_FROM","");
                  name = cmGeneratorTarget::GetProperty(target,(string *)local_2e0);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
                    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                  }
                  pcVar9 = cmMakefile::GetOrCreateSource(this->Makefile,&local_3b0,false,Known);
                  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
                  if ((char)iVar6 == '\0') {
                    if (name.Value == (string *)0x0) {
                      cmGeneratorTarget::AddSource(target,&local_3b0,true);
                    }
                    cmGeneratorTarget::GetPchFile(&local_328,target,local_3b8,local_350,pbVar18);
                    pcVar3 = this->Makefile;
                    local_2e0._0_8_ = local_2e0 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_2e0,"CMAKE_LINK_PCH","");
                    bVar21 = cmMakefile::IsOn(pcVar3,(string *)local_2e0);
                    if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
                      operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                    }
                    if (bVar21) {
                      if (name.Value == (string *)0x0) {
                        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_390,"OBJECT_OUTPUTS","");
                        local_2e0._24_8_ = (local_3b8->_M_dataplus)._M_p;
                        local_2e0._16_8_ = local_3b8->_M_string_length;
                        local_2e0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
                        local_2e0._8_8_ = "$<$<CONFIG:";
                        local_2c0[0] = &DAT_00000002;
                        local_2c0[1] = ">:";
                        local_2b0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_328._M_string_length;
                        local_2b0[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_328._M_dataplus._M_p;
                        local_2a0 = 1;
                        local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)0x6f30e8;
                        views_05._M_len = 5;
                        views_05._M_array = (iterator)local_2e0;
                        cmCatViews_abi_cxx11_(&local_3d8,views_05);
                        cmSourceFile::AppendProperty(pcVar9,&local_390,&local_3d8,false);
LAB_00211124:
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                          operator_delete(local_3d8._M_dataplus._M_p,
                                          local_3d8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        reuseTarget = cmGlobalGenerator::FindGeneratorTarget
                                                (this->GlobalGenerator,name.Value);
                        pcVar3 = this->Makefile;
                        local_2e0._0_8_ = local_2e0 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2e0,"CMAKE_PCH_COPY_COMPILE_PDB","");
                        bVar21 = cmMakefile::IsOn(pcVar3,(string *)local_2e0);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
                          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                        }
                        if (bVar21) {
                          pcVar3 = this->Makefile;
                          local_2e0._24_8_ = (local_350->_M_dataplus)._M_p;
                          local_2e0._16_8_ = local_350->_M_string_length;
                          local_2e0._0_8_ = (pointer)0x6;
                          local_2e0._8_8_ = "CMAKE_";
                          local_2c0[0] = (char *)0xc;
                          local_2c0[1] = "_COMPILER_ID";
                          views_02._M_len = 3;
                          views_02._M_array = (iterator)local_2e0;
                          local_110 = name.Value;
                          cmCatViews_abi_cxx11_(&local_3d8,views_02);
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_3d8);
                          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
                          pcVar4 = (psVar10->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_390,pcVar4,pcVar4 + psVar10->_M_string_length)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                            operator_delete(local_3d8._M_dataplus._M_p,
                                            local_3d8.field_2._M_allocated_capacity + 1);
                          }
                          pcVar3 = this->Makefile;
                          local_2e0._24_8_ = (local_350->_M_dataplus)._M_p;
                          local_2e0._16_8_ = local_350->_M_string_length;
                          local_2e0._0_8_ = (pointer)0x6;
                          local_2e0._8_8_ = "CMAKE_";
                          local_2c0[0] = (char *)0x11;
                          local_2c0[1] = "_COMPILER_VERSION";
                          views_03._M_len = 3;
                          views_03._M_array = (iterator)local_2e0;
                          cmCatViews_abi_cxx11_(&local_348,views_03);
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_348);
                          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                          pcVar4 = (psVar10->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_3d8,pcVar4,pcVar4 + psVar10->_M_string_length)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_348._M_dataplus._M_p != &local_348.field_2) {
                            operator_delete(local_348._M_dataplus._M_p,
                                            local_348.field_2._M_allocated_capacity + 1);
                          }
                          pcVar3 = this->Makefile;
                          local_2e0._24_8_ = (local_350->_M_dataplus)._M_p;
                          local_2e0._16_8_ = local_350->_M_string_length;
                          local_2e0._0_8_ = (pointer)0x6;
                          local_2e0._8_8_ = "CMAKE_";
                          local_2c0[0] = (undefined1 *)0x7;
                          local_2c0[1] = "_FLAGS_";
                          local_2b0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_b8._M_string_length;
                          local_2b0[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_b8._M_dataplus._M_p;
                          views_04._M_len = 4;
                          views_04._M_array = (iterator)local_2e0;
                          cmCatViews_abi_cxx11_(&local_300,views_04);
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_300);
                          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
                          pcVar4 = (psVar10->_M_dataplus)._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_348,pcVar4,pcVar4 + psVar10->_M_string_length)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_300._M_dataplus._M_p != &local_300.field_2) {
                            operator_delete(local_300._M_dataplus._M_p,
                                            local_300.field_2._M_allocated_capacity + 1);
                          }
                          GetMSVCDebugFormatName
                                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2e0,this,local_3b8,target);
                          local_108 = reuseTarget;
                          if (local_2c0[0]._0_1_ == (string)0x1) {
                            iVar6 = std::__cxx11::string::compare((char *)local_2e0);
                            bVar21 = iVar6 == 0;
                            iVar6 = std::__cxx11::string::compare((char *)local_2e0);
                            bVar22 = iVar6 == 0;
                          }
                          else {
                            lVar19 = std::__cxx11::string::find((char *)&local_348,0x6ef73d,0);
                            bVar22 = true;
                            bVar21 = true;
                            if (lVar19 == -1) {
                              lVar19 = std::__cxx11::string::find((char *)&local_348,0x6ef741,0);
                              bVar21 = lVar19 != -1;
                            }
                            lVar19 = std::__cxx11::string::find((char *)&local_348,0x6ef745,0);
                            if (lVar19 == -1) {
                              lVar19 = std::__cxx11::string::find((char *)&local_348,0x6ef749,0);
                              bVar22 = lVar19 != -1;
                            }
                          }
                          if ((local_2c0[0]._0_1_ == (string)0x1) &&
                             (local_2c0[0] = (char *)((ulong)local_2c0[0] & 0xffffffffffffff00),
                             (undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10)) {
                            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                          }
                          bVar5 = cmSystemTools::VersionCompare(OP_LESS,&local_3d8,"16.0");
                          if (bVar5) {
                            iVar6 = std::__cxx11::string::compare((char *)&local_390);
                            bVar5 = iVar6 == 0;
                          }
                          else {
                            bVar5 = false;
                          }
                          pcVar3 = this->Makefile;
                          local_2e0._0_8_ = local_2e0 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2e0,"CMAKE_VS_PLATFORM_TOOLSET","");
                          psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_2e0);
                          iVar6 = std::__cxx11::string::compare((char *)psVar10);
                          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10)) {
                            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                          }
                          reuseTarget = local_108;
                          if ((bool)(bVar21 | bVar5 & iVar6 != 0)) {
                            local_2e0._0_8_ = local_2e0 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2e0,".pdb","");
                            reuseTarget = local_108;
                            local_2c0[0] = (char *)local_2b0;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2c0,".idb","");
                            __l._M_len = 2;
                            __l._M_array = (string *)local_2e0;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_300,__l,(allocator_type *)&local_f8);
                            CopyPchCompilePdb(this,local_3b8,target,local_110,reuseTarget,
                                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&local_300);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_300);
                            lVar19 = -0x40;
                            puVar17 = (undefined1 *)local_2b0;
                            do {
                              if (puVar17 != *(undefined1 **)(puVar17 + 0xfffffffffffffff0)) {
                                operator_delete(*(undefined1 **)(puVar17 + 0xfffffffffffffff0),
                                                *(long *)puVar17 + 1);
                              }
                              puVar17 = puVar17 + 0xffffffffffffffe0;
                              lVar19 = lVar19 + 0x20;
                            } while (lVar19 != 0);
                          }
                          else if (bVar22) {
                            local_2e0._0_8_ = local_2e0 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2e0,".pdb","");
                            __l_00._M_len = 1;
                            __l_00._M_array = (string *)local_2e0;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_300,__l_00,(allocator_type *)&local_f8);
                            CopyPchCompilePdb(this,local_3b8,target,local_110,reuseTarget,
                                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&local_300);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&local_300);
                            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10))
                            {
                              operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_348._M_dataplus._M_p != &local_348.field_2) {
                            operator_delete(local_348._M_dataplus._M_p,
                                            local_348.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                            operator_delete(local_3d8._M_dataplus._M_p,
                                            local_3d8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_390._M_dataplus._M_p != &local_390.field_2) {
                            operator_delete(local_390._M_dataplus._M_p,
                                            CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                                     local_390.field_2._M_local_buf[0]) + 1);
                          }
                        }
                        cmGeneratorTarget::GetPchFileObject
                                  (&local_390,reuseTarget,local_3b8,local_350,pbVar18);
                        TVar7 = cmGeneratorTarget::GetType(target);
                        if (TVar7 != OBJECT_LIBRARY) {
                          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_3d8,"LINK_FLAGS_","");
                          TVar7 = cmGeneratorTarget::GetType(target);
                          if (TVar7 == STATIC_LIBRARY) {
                            std::__cxx11::string::_M_replace
                                      ((ulong)&local_3d8,0,(char *)local_3d8._M_string_length,
                                       0x6eee8d);
                          }
                          pcVar2 = target->Target;
                          local_2e0._0_8_ = local_3d8._M_string_length;
                          local_2e0._8_8_ = local_3d8._M_dataplus._M_p;
                          local_2e0._16_8_ = local_b8._M_string_length;
                          local_2e0._24_8_ = local_b8._M_dataplus._M_p;
                          views_07._M_len = 2;
                          views_07._M_array = (iterator)local_2e0;
                          cmCatViews_abi_cxx11_(&local_348,views_07);
                          source._M_str = local_390._M_dataplus._M_p;
                          source._M_len = local_390._M_string_length;
                          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                                    (&local_f8,local_90,source,SHELL);
                          local_2e0._0_8_ = &DAT_00000001;
                          local_2e0._8_8_ = " ";
                          local_2e0._16_8_ = local_f8._M_string_length;
                          local_2e0._24_8_ = local_f8._M_dataplus._M_p;
                          views_08._M_len = 2;
                          views_08._M_array = (iterator)local_2e0;
                          cmCatViews_abi_cxx11_(&local_300,views_08);
                          local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00;
                          cmTarget::AppendProperty
                                    (pcVar2,&local_348,&local_300,
                                     (optional<cmListFileBacktrace> *)local_2e0,true);
                          if ((local_2e0[0x10] == '\x01') &&
                             (local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00,
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_2e0._8_8_);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_300._M_dataplus._M_p != &local_300.field_2) {
                            operator_delete(local_300._M_dataplus._M_p,
                                            local_300.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                            operator_delete(local_f8._M_dataplus._M_p,
                                            local_f8.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_348._M_dataplus._M_p != &local_348.field_2) {
                            operator_delete(local_348._M_dataplus._M_p,
                                            local_348.field_2._M_allocated_capacity + 1);
                          }
                          goto LAB_00211124;
                        }
                        TVar7 = cmGeneratorTarget::GetType(reuseTarget);
                        if (TVar7 == OBJECT_LIBRARY) {
                          pcVar2 = target->Target;
                          local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_3d8,"INTERFACE_LINK_LIBRARIES","");
                          local_2e0._24_8_ = (local_3b8->_M_dataplus)._M_p;
                          local_2e0._16_8_ = local_3b8->_M_string_length;
                          local_2e0._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
                          local_2e0._8_8_ = "$<$<CONFIG:";
                          local_2c0[0] = (undefined1 *)0xe;
                          local_2c0[1] = ">:$<LINK_ONLY:";
                          local_2b0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_390._M_string_length;
                          local_2b0[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_390._M_dataplus._M_p;
                          local_2a0 = 2;
                          local_298 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)0x6efc95;
                          views_06._M_len = 5;
                          views_06._M_array = (iterator)local_2e0;
                          cmCatViews_abi_cxx11_(&local_348,views_06);
                          local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00;
                          cmTarget::AppendProperty
                                    (pcVar2,&local_3d8,&local_348,
                                     (optional<cmListFileBacktrace> *)local_2e0,false);
                          if ((local_2e0[0x10] == '\x01') &&
                             (local_2e0._16_8_ = local_2e0._16_8_ & 0xffffffffffffff00,
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_2e0._8_8_);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_348._M_dataplus._M_p != &local_348.field_2) {
                            operator_delete(local_348._M_dataplus._M_p,
                                            local_348.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                            operator_delete(local_3d8._M_dataplus._M_p,
                                            local_3d8.field_2._M_allocated_capacity + 1);
                          }
                          cmGeneratorTarget::ClearLinkInterfaceCache(target);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_390._M_dataplus._M_p != &local_390.field_2) {
                        sVar14 = CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                          local_390.field_2._M_local_buf[0]);
                        _Var15._M_p = local_390._M_dataplus._M_p;
LAB_00211154:
                        operator_delete(_Var15._M_p,sVar14 + 1);
                      }
                    }
                    else {
                      local_2e0._0_8_ = local_2e0 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2e0,"PCH_EXTENSION","");
                      cmSourceFile::SetProperty(pcVar9,(string *)local_2e0,cVar8);
                      sVar14 = local_2e0._16_8_;
                      _Var15._M_p = (pointer)local_2e0._0_8_;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._0_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e0 + 0x10))
                      goto LAB_00211154;
                    }
                    pcVar9 = cmMakefile::GetOrCreateSource(this->Makefile,&local_370,false,Known);
                    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
                    local_390._M_string_length = 0;
                    local_390.field_2._M_local_buf[0] = '\0';
                    cmSourceFile::ResolveFullPath(pcVar9,&local_390,(string *)0x0);
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390._M_string_length
                        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2e0,"Unable to resolve full path of PCH-header \'"
                                 ,0x2b);
                      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_2e0,local_370._M_dataplus._M_p,
                                           local_370._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,"\' assigned to target ",0x15);
                      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(target);
                      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar12,(psVar10->_M_dataplus)._M_p,
                                           psVar10->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,", although its path is supposed to be known!",0x2c);
                      std::__cxx11::stringbuf::str();
                      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,
                                          &local_3d8,local_88);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                        operator_delete(local_3d8._M_dataplus._M_p,
                                        local_3d8.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
                      std::ios_base::~ios_base(local_270);
                    }
                    cmGeneratorTarget::AddSource(target,&local_370,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_390._M_dataplus._M_p != &local_390.field_2) {
                      operator_delete(local_390._M_dataplus._M_p,
                                      CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                               local_390.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p != &local_328.field_2) {
                      operator_delete(local_328._M_dataplus._M_p,
                                      local_328.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._M_dataplus._M_p != &local_370.field_2) {
                operator_delete(local_370._M_dataplus._M_p,
                                local_370.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
                operator_delete(local_3b0._M_dataplus._M_p,
                                CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                                         local_3b0.field_2._M_local_buf[0]) + 1);
              }
              pbVar18 = pbVar18 + 1;
            } while (pbVar18 != local_80);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_148);
        }
        lVar19 = local_100 + 0x20;
      } while (lVar19 != 0x80);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pbVar18 = local_3b8 + 1;
    } while (pbVar18 != local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void cmLocalGenerator::AddPchDependencies(cmGeneratorTarget* target)
{
  std::vector<std::string> configsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& config : configsList) {
    // FIXME: Refactor collection of sources to not evaluate object
    // libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, config);

    const std::string configUpper = cmSystemTools::UpperCase(config);
    static const std::array<std::string, 4> langs = { { "C", "CXX", "OBJC",
                                                        "OBJCXX" } };

    std::set<std::string> pchLangSet;
    if (this->GetGlobalGenerator()->IsXcode()) {
      for (const std::string& lang : langs) {
        const std::string pchHeader = target->GetPchHeader(config, lang, "");
        if (!pchHeader.empty()) {
          pchLangSet.emplace(lang);
        }
      }
    }

    for (const std::string& lang : langs) {
      auto langSources = std::count_if(
        sources.begin(), sources.end(), [lang](cmSourceFile* sf) {
          return lang == sf->GetLanguage() &&
            !sf->GetProperty("SKIP_PRECOMPILE_HEADERS");
        });
      if (langSources == 0) {
        continue;
      }

      std::vector<std::string> architectures;
      if (!this->GetGlobalGenerator()->IsXcode()) {
        target->GetAppleArchs(config, architectures);
      }
      if (architectures.empty()) {
        architectures.emplace_back();
      } else {
        std::string useMultiArchPch;
        for (const std::string& arch : architectures) {
          const std::string pchHeader =
            target->GetPchHeader(config, lang, arch);
          if (!pchHeader.empty()) {
            useMultiArchPch = cmStrCat(useMultiArchPch, ";-Xarch_", arch,
                                       ";-include", pchHeader);
          }
        }

        if (!useMultiArchPch.empty()) {

          target->Target->AppendProperty(
            cmStrCat(lang, "_COMPILE_OPTIONS_USE_PCH"),
            cmStrCat("$<$<CONFIG:", config, ">:", useMultiArchPch, ">"));
        }
      }

      for (const std::string& arch : architectures) {
        const std::string pchSource = target->GetPchSource(config, lang, arch);
        const std::string pchHeader = target->GetPchHeader(config, lang, arch);

        if (pchSource.empty() || pchHeader.empty()) {
          if (this->GetGlobalGenerator()->IsXcode() && !pchLangSet.empty()) {
            for (auto* sf : sources) {
              const auto sourceLanguage = sf->GetLanguage();
              if (!sourceLanguage.empty() &&
                  pchLangSet.find(sourceLanguage) == pchLangSet.end()) {
                sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
              }
            }
          }
          continue;
        }

        cmValue pchExtension =
          this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

        if (pchExtension.IsEmpty()) {
          continue;
        }

        cmValue ReuseFrom =
          target->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

        auto* pch_sf = this->Makefile->GetOrCreateSource(
          pchSource, false, cmSourceFileLocationKind::Known);

        if (!this->GetGlobalGenerator()->IsXcode()) {
          if (!ReuseFrom) {
            target->AddSource(pchSource, true);
          }

          const std::string pchFile = target->GetPchFile(config, lang, arch);

          // Exclude the pch files from linking
          if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
            if (!ReuseFrom) {
              pch_sf->AppendProperty(
                "OBJECT_OUTPUTS",
                cmStrCat("$<$<CONFIG:", config, ">:", pchFile, ">"));
            } else {
              auto* reuseTarget =
                this->GlobalGenerator->FindGeneratorTarget(*ReuseFrom);

              if (this->Makefile->IsOn("CMAKE_PCH_COPY_COMPILE_PDB")) {

                const std::string compilerId =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

                const std::string compilerVersion =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_VERSION"));

                const std::string langFlags =
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_FLAGS_", configUpper));

                bool editAndContinueDebugInfo = false;
                bool programDatabaseDebugInfo = false;
                if (cm::optional<std::string> msvcDebugInformationFormat =
                      this->GetMSVCDebugFormatName(config, target)) {
                  editAndContinueDebugInfo =
                    *msvcDebugInformationFormat == "EditAndContinue";
                  programDatabaseDebugInfo =
                    *msvcDebugInformationFormat == "ProgramDatabase";
                } else {
                  editAndContinueDebugInfo =
                    langFlags.find("/ZI") != std::string::npos ||
                    langFlags.find("-ZI") != std::string::npos;
                  programDatabaseDebugInfo =
                    langFlags.find("/Zi") != std::string::npos ||
                    langFlags.find("-Zi") != std::string::npos;
                }

                // MSVC 2008 is producing both .pdb and .idb files with /Zi.
                bool msvc2008OrLess =
                  cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                                compilerVersion, "16.0") &&
                  compilerId == "MSVC";
                // but not when used via toolset -Tv90
                if (this->Makefile->GetSafeDefinition(
                      "CMAKE_VS_PLATFORM_TOOLSET") == "v90") {
                  msvc2008OrLess = false;
                }

                if (editAndContinueDebugInfo || msvc2008OrLess) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb", ".idb" });
                } else if (programDatabaseDebugInfo) {
                  this->CopyPchCompilePdb(config, target, *ReuseFrom,
                                          reuseTarget, { ".pdb" });
                }
              }

              // Link to the pch object file
              std::string pchSourceObj =
                reuseTarget->GetPchFileObject(config, lang, arch);

              if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
                std::string linkerProperty = "LINK_FLAGS_";
                if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
                  linkerProperty = "STATIC_LIBRARY_FLAGS_";
                }
                target->Target->AppendProperty(
                  cmStrCat(linkerProperty, configUpper),
                  cmStrCat(" ",
                           this->ConvertToOutputFormat(pchSourceObj, SHELL)),
                  cm::nullopt, true);
              } else if (reuseTarget->GetType() ==
                         cmStateEnums::OBJECT_LIBRARY) {
                // FIXME: This can propagate more than one level, unlike
                // the rest of the object files in an object library.
                // Find another way to do this.
                target->Target->AppendProperty(
                  "INTERFACE_LINK_LIBRARIES",
                  cmStrCat("$<$<CONFIG:", config,
                           ">:$<LINK_ONLY:", pchSourceObj, ">>"));
                // We updated the link interface, so ensure it is recomputed.
                target->ClearLinkInterfaceCache();
              }
            }
          } else {
            pch_sf->SetProperty("PCH_EXTENSION", pchExtension);
          }

          // Add pchHeader to source files, which will
          // be grouped as "Precompile Header File"
          auto* pchHeader_sf = this->Makefile->GetOrCreateSource(
            pchHeader, false, cmSourceFileLocationKind::Known);
          std::string err;
          pchHeader_sf->ResolveFullPath(&err);
          if (!err.empty()) {
            std::ostringstream msg;
            msg << "Unable to resolve full path of PCH-header '" << pchHeader
                << "' assigned to target " << target->GetName()
                << ", although its path is supposed to be known!";
            this->IssueMessage(MessageType::FATAL_ERROR, msg.str());
          }
          target->AddSource(pchHeader);
        }
      }
    }
  }
}